

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# dynamic_integer_points_kd_tree_encoder.h
# Opt level: O1

void __thiscall
draco::DynamicIntegerPointsKdTreeEncoder<5>::
EncodeInternal<draco::PointDVector<unsigned_int>::PointDVectorIterator>
          (DynamicIntegerPointsKdTreeEncoder<5> *this,PointDVectorIterator begin,
          PointDVectorIterator end)

{
  int *piVar1;
  vector<unsigned_int,_std::allocator<unsigned_int>_> *__x;
  uint32_t uVar2;
  uint uVar3;
  uint32_t uVar4;
  size_t sVar5;
  size_t sVar6;
  pointer pvVar7;
  pointer puVar8;
  uint *puVar9;
  PointDVector<unsigned_int> *pPVar10;
  PointDVectorIterator PVar11;
  PointDVectorIterator PVar12;
  uint uVar13;
  ulong uVar14;
  _Elt_pointer pEVar15;
  ulong uVar16;
  uint uVar17;
  int iVar18;
  uint uVar19;
  uint uVar20;
  ulong uVar21;
  bool bVar22;
  PointDVectorIterator split;
  stack<draco::DynamicIntegerPointsKdTreeEncoder<5>::EncodingStatus<draco::PointDVector<unsigned_int>::PointDVectorIterator>,_std::deque<draco::DynamicIntegerPointsKdTreeEncoder<5>::EncodingStatus<draco::PointDVector<unsigned_int>::PointDVectorIterator>,_std::allocator<draco::DynamicIntegerPointsKdTreeEncoder<5>::EncodingStatus<draco::PointDVector<unsigned_int>::PointDVectorIterator>_>_>_>
  status_stack;
  int local_140;
  undefined4 uStack_13c;
  PointDVector<unsigned_int> *pPStack_138;
  uint32_t local_130;
  undefined4 uStack_12c;
  EncodingStatus<draco::PointDVector<unsigned_int>::PointDVectorIterator> local_128;
  _Deque_base<draco::DynamicIntegerPointsKdTreeEncoder<5>::EncodingStatus<draco::PointDVector<unsigned_int>::PointDVectorIterator>,_std::allocator<draco::DynamicIntegerPointsKdTreeEncoder<5>::EncodingStatus<draco::PointDVector<unsigned_int>::PointDVectorIterator>_>_>
  local_e8;
  EncodingStatus<draco::PointDVector<unsigned_int>::PointDVectorIterator> local_98;
  DirectBitEncoder *local_50;
  FoldedBit32Encoder<draco::RAnsBitEncoder> *local_48;
  ulong local_40;
  PointDVector<unsigned_int> *local_38;
  
  PVar12 = end;
  PVar11 = begin;
  local_98.begin.item_ = local_98.begin.item_ & 0xffffffff00000000;
  std::vector<unsigned_int,_std::allocator<unsigned_int>_>::vector
            ((vector<unsigned_int,_std::allocator<unsigned_int>_> *)&local_e8,
             (ulong)this->dimension_,(value_type_conflict5 *)&local_98,(allocator_type *)&local_128)
  ;
  std::vector<unsigned_int,_std::allocator<unsigned_int>_>::_M_move_assign
            ((this->base_stack_).
             super__Vector_base<std::vector<unsigned_int,_std::allocator<unsigned_int>_>,_std::allocator<std::vector<unsigned_int,_std::allocator<unsigned_int>_>_>_>
             ._M_impl.super__Vector_impl_data._M_start,&local_e8);
  if (local_e8._M_impl.super__Deque_impl_data._M_map != (_Map_pointer)0x0) {
    operator_delete(local_e8._M_impl.super__Deque_impl_data._M_map,
                    (long)local_e8._M_impl.super__Deque_impl_data._M_start._M_cur -
                    (long)local_e8._M_impl.super__Deque_impl_data._M_map);
  }
  local_98.begin.item_ = local_98.begin.item_ & 0xffffffff00000000;
  std::vector<unsigned_int,_std::allocator<unsigned_int>_>::vector
            ((vector<unsigned_int,_std::allocator<unsigned_int>_> *)&local_e8,
             (ulong)this->dimension_,(value_type_conflict5 *)&local_98,(allocator_type *)&local_128)
  ;
  std::vector<unsigned_int,_std::allocator<unsigned_int>_>::_M_move_assign
            ((this->levels_stack_).
             super__Vector_base<std::vector<unsigned_int,_std::allocator<unsigned_int>_>,_std::allocator<std::vector<unsigned_int,_std::allocator<unsigned_int>_>_>_>
             ._M_impl.super__Vector_impl_data._M_start);
  if (local_e8._M_impl.super__Deque_impl_data._M_map != (_Map_pointer)0x0) {
    operator_delete(local_e8._M_impl.super__Deque_impl_data._M_map,
                    (long)local_e8._M_impl.super__Deque_impl_data._M_start._M_cur -
                    (long)local_e8._M_impl.super__Deque_impl_data._M_map);
  }
  local_98.begin.dimensionality_ = begin.dimensionality_;
  local_98.begin._20_4_ = begin._20_4_;
  local_98.begin.item_ = PVar11.item_;
  pPVar10 = PVar11.vec_;
  local_98.end.item_ = end.item_;
  sVar5 = local_98.end.item_;
  local_98.end.vec_ = end.vec_;
  local_98.end.dimensionality_ = end.dimensionality_;
  local_98.end._20_4_ = end._20_4_;
  local_98.last_axis = 0;
  local_98.stack_pos = 0;
  local_98.end.item_._0_4_ = (int)PVar12.item_;
  local_98.num_remaining_points = (int)local_98.end.item_ - (int)begin.item_;
  local_e8._M_impl.super__Deque_impl_data._M_finish._M_last = (_Elt_pointer)0x0;
  local_e8._M_impl.super__Deque_impl_data._M_finish._M_node = (_Map_pointer)0x0;
  local_e8._M_impl.super__Deque_impl_data._M_finish._M_cur = (_Elt_pointer)0x0;
  local_e8._M_impl.super__Deque_impl_data._M_finish._M_first = (_Elt_pointer)0x0;
  local_e8._M_impl.super__Deque_impl_data._M_start._M_last = (_Elt_pointer)0x0;
  local_e8._M_impl.super__Deque_impl_data._M_start._M_node = (_Map_pointer)0x0;
  local_e8._M_impl.super__Deque_impl_data._M_start._M_cur = (_Elt_pointer)0x0;
  local_e8._M_impl.super__Deque_impl_data._M_start._M_first = (_Elt_pointer)0x0;
  local_e8._M_impl.super__Deque_impl_data._M_map = (_Map_pointer)0x0;
  local_e8._M_impl.super__Deque_impl_data._M_map_size = 0;
  local_98.begin.vec_ = pPVar10;
  local_98.end.item_ = sVar5;
  std::
  _Deque_base<draco::DynamicIntegerPointsKdTreeEncoder<5>::EncodingStatus<draco::PointDVector<unsigned_int>::PointDVectorIterator>,_std::allocator<draco::DynamicIntegerPointsKdTreeEncoder<5>::EncodingStatus<draco::PointDVector<unsigned_int>::PointDVectorIterator>_>_>
  ::_M_initialize_map(&local_e8,0);
  if (local_e8._M_impl.super__Deque_impl_data._M_finish._M_cur ==
      local_e8._M_impl.super__Deque_impl_data._M_finish._M_last + -1) {
    std::
    deque<draco::DynamicIntegerPointsKdTreeEncoder<5>::EncodingStatus<draco::PointDVector<unsigned_int>::PointDVectorIterator>,std::allocator<draco::DynamicIntegerPointsKdTreeEncoder<5>::EncodingStatus<draco::PointDVector<unsigned_int>::PointDVectorIterator>>>
    ::
    _M_push_back_aux<draco::DynamicIntegerPointsKdTreeEncoder<5>::EncodingStatus<draco::PointDVector<unsigned_int>::PointDVectorIterator>const&>
              ((deque<draco::DynamicIntegerPointsKdTreeEncoder<5>::EncodingStatus<draco::PointDVector<unsigned_int>::PointDVectorIterator>,std::allocator<draco::DynamicIntegerPointsKdTreeEncoder<5>::EncodingStatus<draco::PointDVector<unsigned_int>::PointDVectorIterator>>>
                *)&local_e8,&local_98);
  }
  else {
    (local_e8._M_impl.super__Deque_impl_data._M_finish._M_cur)->last_axis = local_98.last_axis;
    (local_e8._M_impl.super__Deque_impl_data._M_finish._M_cur)->num_remaining_points =
         local_98.num_remaining_points;
    *(ulong *)&(local_e8._M_impl.super__Deque_impl_data._M_finish._M_cur)->stack_pos =
         CONCAT44(local_98._60_4_,local_98.stack_pos);
    ((local_e8._M_impl.super__Deque_impl_data._M_finish._M_cur)->end).vec_ = local_98.end.vec_;
    ((local_e8._M_impl.super__Deque_impl_data._M_finish._M_cur)->end).dimensionality_ =
         local_98.end.dimensionality_;
    *(undefined4 *)&((local_e8._M_impl.super__Deque_impl_data._M_finish._M_cur)->end).field_0x14 =
         local_98.end._20_4_;
    ((local_e8._M_impl.super__Deque_impl_data._M_finish._M_cur)->begin).dimensionality_ =
         local_98.begin.dimensionality_;
    *(undefined4 *)&((local_e8._M_impl.super__Deque_impl_data._M_finish._M_cur)->begin).field_0x14 =
         local_98.begin._20_4_;
    ((local_e8._M_impl.super__Deque_impl_data._M_finish._M_cur)->end).item_ = local_98.end.item_;
    ((local_e8._M_impl.super__Deque_impl_data._M_finish._M_cur)->begin).item_ = local_98.begin.item_
    ;
    ((local_e8._M_impl.super__Deque_impl_data._M_finish._M_cur)->begin).vec_ = local_98.begin.vec_;
    local_e8._M_impl.super__Deque_impl_data._M_finish._M_cur =
         local_e8._M_impl.super__Deque_impl_data._M_finish._M_cur + 1;
  }
  if (local_e8._M_impl.super__Deque_impl_data._M_finish._M_cur !=
      local_e8._M_impl.super__Deque_impl_data._M_start._M_cur) {
    local_50 = &this->half_encoder_;
    local_48 = &this->numbers_encoder_;
    local_38 = pPVar10;
    do {
      pEVar15 = local_e8._M_impl.super__Deque_impl_data._M_finish._M_cur;
      if (local_e8._M_impl.super__Deque_impl_data._M_finish._M_cur ==
          local_e8._M_impl.super__Deque_impl_data._M_finish._M_first) {
        pEVar15 = local_e8._M_impl.super__Deque_impl_data._M_finish._M_node[-1] + 8;
      }
      sVar5 = pEVar15[-1].begin.item_;
      sVar6 = pEVar15[-1].end.item_;
      uVar2 = pEVar15[-1].last_axis;
      uVar3 = pEVar15[-1].stack_pos;
      if (local_e8._M_impl.super__Deque_impl_data._M_finish._M_cur ==
          local_e8._M_impl.super__Deque_impl_data._M_finish._M_first) {
        operator_delete(local_e8._M_impl.super__Deque_impl_data._M_finish._M_first,0x200);
        local_e8._M_impl.super__Deque_impl_data._M_finish._M_first =
             local_e8._M_impl.super__Deque_impl_data._M_finish._M_node[-1];
        local_e8._M_impl.super__Deque_impl_data._M_finish._M_last =
             local_e8._M_impl.super__Deque_impl_data._M_finish._M_first + 8;
        local_e8._M_impl.super__Deque_impl_data._M_finish._M_cur =
             local_e8._M_impl.super__Deque_impl_data._M_finish._M_first + 7;
        local_e8._M_impl.super__Deque_impl_data._M_finish._M_node =
             local_e8._M_impl.super__Deque_impl_data._M_finish._M_node + -1;
      }
      else {
        local_e8._M_impl.super__Deque_impl_data._M_finish._M_cur =
             local_e8._M_impl.super__Deque_impl_data._M_finish._M_cur + -1;
      }
      begin.item_._0_4_ = (int)sVar5;
      pvVar7 = (this->levels_stack_).
               super__Vector_base<std::vector<unsigned_int,_std::allocator<unsigned_int>_>,_std::allocator<std::vector<unsigned_int,_std::allocator<unsigned_int>_>_>_>
               ._M_impl.super__Vector_impl_data._M_start;
      uVar21 = (ulong)(uVar2 + 1);
      if (this->dimension_ - 1 == uVar2) {
        uVar21 = 0;
      }
      uVar2 = this->bit_length_;
      uVar4 = *(uint32_t *)
               (*(long *)&pvVar7[uVar3].
                          super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
                          super__Vector_impl_data + uVar21 * 4);
      if (uVar2 != uVar4) {
        uVar13 = (uint)(sVar6 - sVar5);
        uVar19 = (uint)uVar21;
        if (uVar13 < 3) {
          puVar8 = (this->axes_).super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>.
                   _M_impl.super__Vector_impl_data._M_start;
          *puVar8 = uVar19;
          uVar21 = (ulong)this->dimension_;
          if (1 < this->dimension_) {
            uVar19 = *puVar8;
            uVar16 = 1;
            do {
              bVar22 = uVar19 == (int)uVar21 - 1U;
              uVar19 = uVar19 + 1;
              if (bVar22) {
                uVar19 = 0;
              }
              puVar8[uVar16] = uVar19;
              uVar16 = uVar16 + 1;
              uVar21 = (ulong)this->dimension_;
            } while (uVar16 < uVar21);
          }
          if (uVar13 != 0) {
            uVar21 = 0;
            do {
              if (this->dimension_ != 0) {
                uVar19 = local_38->dimensionality_;
                puVar9 = local_38->data0_;
                uVar16 = 0;
                do {
                  uVar14 = (ulong)(this->axes_).
                                  super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>.
                                  _M_impl.super__Vector_impl_data._M_start[uVar16];
                  iVar18 = this->bit_length_ -
                           *(int *)(*(long *)&pvVar7[uVar3].
                                              super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>
                                              ._M_impl.super__Vector_impl_data + uVar14 * 4);
                  if (iVar18 != 0) {
                    DirectBitEncoder::EncodeLeastSignificantBits32
                              (&this->remaining_bits_encoder_,iVar18,
                               puVar9[(ulong)uVar19 * (sVar5 + uVar21) + uVar14]);
                  }
                  uVar16 = uVar16 + 1;
                } while (uVar16 < this->dimension_);
              }
              uVar21 = uVar21 + 1;
            } while (uVar21 != (uVar13 & 3));
          }
        }
        else {
          pvVar7 = (this->base_stack_).
                   super__Vector_base<std::vector<unsigned_int,_std::allocator<unsigned_int>_>,_std::allocator<std::vector<unsigned_int,_std::allocator<unsigned_int>_>_>_>
                   ._M_impl.super__Vector_impl_data._M_start;
          uVar16 = (ulong)(uVar3 + 1);
          local_40 = uVar16;
          std::vector<unsigned_int,_std::allocator<unsigned_int>_>::operator=
                    (pvVar7 + uVar16,pvVar7 + uVar3);
          pvVar7 = (this->base_stack_).
                   super__Vector_base<std::vector<unsigned_int,_std::allocator<unsigned_int>_>,_std::allocator<std::vector<unsigned_int,_std::allocator<unsigned_int>_>_>_>
                   ._M_impl.super__Vector_impl_data._M_start;
          piVar1 = (int *)(*(long *)&pvVar7[uVar16].
                                     super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>
                                     ._M_impl.super__Vector_impl_data + uVar21 * 4);
          *piVar1 = *piVar1 + (1 << ((char)uVar2 + ~(byte)uVar4 & 0x1f));
          std::
          __partition<draco::PointDVector<unsigned_int>::PointDVectorIterator,draco::DynamicIntegerPointsKdTreeEncoder<5>::Splitter>
                    (&local_140,
                     (ulong)*(uint *)(*(long *)&pvVar7[uVar16].
                                                super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>
                                                ._M_impl.super__Vector_impl_data + uVar21 * 4) <<
                     0x20 | uVar21);
          uVar20 = (int)sVar6 - local_140;
          uVar17 = local_140 - (int)begin.item_;
          if (uVar17 != uVar20) {
            DirectBitEncoder::EncodeBit(local_50,uVar17 < uVar20);
          }
          iVar18 = 0x1f;
          if (uVar13 != 0) {
            for (; uVar13 >> iVar18 == 0; iVar18 = iVar18 + -1) {
            }
          }
          if (uVar17 < uVar20) {
            uVar20 = uVar17;
          }
          FoldedBit32Encoder<draco::RAnsBitEncoder>::EncodeLeastSignificantBits32
                    (local_48,iVar18,((uint)(sVar6 - sVar5 >> 1) & 0x7fffffff) - uVar20);
          pvVar7 = (this->levels_stack_).
                   super__Vector_base<std::vector<unsigned_int,_std::allocator<unsigned_int>_>,_std::allocator<std::vector<unsigned_int,_std::allocator<unsigned_int>_>_>_>
                   ._M_impl.super__Vector_impl_data._M_start;
          __x = pvVar7 + uVar3;
          puVar8 = (__x->super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>)._M_impl.
                   super__Vector_impl_data._M_start + uVar21;
          *puVar8 = *puVar8 + 1;
          std::vector<unsigned_int,_std::allocator<unsigned_int>_>::operator=(pvVar7 + uVar16,__x);
          if (CONCAT44(uStack_13c,local_140) != sVar5) {
            local_128.begin.dimensionality_ = begin.dimensionality_;
            local_128.begin._20_4_ = begin._20_4_;
            local_128.end.dimensionality_ = local_130;
            local_128.end._20_4_ = uStack_12c;
            local_128.end.item_ = CONCAT44(uStack_13c,local_140);
            local_128.end.vec_ = pPStack_138;
            local_128.num_remaining_points = local_140 - (int)begin.item_;
            local_128.begin.item_ = sVar5;
            local_128.begin.vec_ = pPVar10;
            local_128.last_axis = uVar19;
            local_128.stack_pos = uVar3;
            std::
            deque<draco::DynamicIntegerPointsKdTreeEncoder<5>::EncodingStatus<draco::PointDVector<unsigned_int>::PointDVectorIterator>,std::allocator<draco::DynamicIntegerPointsKdTreeEncoder<5>::EncodingStatus<draco::PointDVector<unsigned_int>::PointDVectorIterator>>>
            ::
            emplace_back<draco::DynamicIntegerPointsKdTreeEncoder<5>::EncodingStatus<draco::PointDVector<unsigned_int>::PointDVectorIterator>>
                      ((deque<draco::DynamicIntegerPointsKdTreeEncoder<5>::EncodingStatus<draco::PointDVector<unsigned_int>::PointDVectorIterator>,std::allocator<draco::DynamicIntegerPointsKdTreeEncoder<5>::EncodingStatus<draco::PointDVector<unsigned_int>::PointDVectorIterator>>>
                        *)&local_e8,&local_128);
          }
          if (CONCAT44(uStack_13c,local_140) != sVar6) {
            local_128.begin.dimensionality_ = local_130;
            local_128.begin._20_4_ = uStack_12c;
            local_128.begin.item_ = CONCAT44(uStack_13c,local_140);
            local_128.begin.vec_ = pPStack_138;
            local_128.end.dimensionality_ = end.dimensionality_;
            local_128.end._20_4_ = end._20_4_;
            local_128.end.vec_ = end.vec_;
            local_128.stack_pos = (uint32_t)local_40;
            local_128.num_remaining_points = (int)sVar6 - local_140;
            local_128.end.item_ = sVar6;
            local_128.last_axis = uVar19;
            std::
            deque<draco::DynamicIntegerPointsKdTreeEncoder<5>::EncodingStatus<draco::PointDVector<unsigned_int>::PointDVectorIterator>,std::allocator<draco::DynamicIntegerPointsKdTreeEncoder<5>::EncodingStatus<draco::PointDVector<unsigned_int>::PointDVectorIterator>>>
            ::
            emplace_back<draco::DynamicIntegerPointsKdTreeEncoder<5>::EncodingStatus<draco::PointDVector<unsigned_int>::PointDVectorIterator>>
                      ((deque<draco::DynamicIntegerPointsKdTreeEncoder<5>::EncodingStatus<draco::PointDVector<unsigned_int>::PointDVectorIterator>,std::allocator<draco::DynamicIntegerPointsKdTreeEncoder<5>::EncodingStatus<draco::PointDVector<unsigned_int>::PointDVectorIterator>>>
                        *)&local_e8,&local_128);
          }
        }
      }
    } while (local_e8._M_impl.super__Deque_impl_data._M_finish._M_cur !=
             local_e8._M_impl.super__Deque_impl_data._M_start._M_cur);
  }
  std::
  _Deque_base<draco::DynamicIntegerPointsKdTreeEncoder<5>::EncodingStatus<draco::PointDVector<unsigned_int>::PointDVectorIterator>,_std::allocator<draco::DynamicIntegerPointsKdTreeEncoder<5>::EncodingStatus<draco::PointDVector<unsigned_int>::PointDVectorIterator>_>_>
  ::~_Deque_base(&local_e8);
  return;
}

Assistant:

void DynamicIntegerPointsKdTreeEncoder<compression_level_t>::EncodeInternal(
    RandomAccessIteratorT begin, RandomAccessIteratorT end) {
  typedef EncodingStatus<RandomAccessIteratorT> Status;

  base_stack_[0] = VectorUint32(dimension_, 0);
  levels_stack_[0] = VectorUint32(dimension_, 0);
  Status init_status(begin, end, 0, 0);
  std::stack<Status> status_stack;
  status_stack.push(init_status);

  // TODO(b/199760123): Use preallocated vector instead of stack.
  while (!status_stack.empty()) {
    Status status = status_stack.top();
    status_stack.pop();

    begin = status.begin;
    end = status.end;
    const uint32_t last_axis = status.last_axis;
    const uint32_t stack_pos = status.stack_pos;
    const VectorUint32 &old_base = base_stack_[stack_pos];
    const VectorUint32 &levels = levels_stack_[stack_pos];

    const uint32_t axis =
        GetAndEncodeAxis(begin, end, old_base, levels, last_axis);
    const uint32_t level = levels[axis];
    const uint32_t num_remaining_points = static_cast<uint32_t>(end - begin);

    // If this happens all axis are subdivided to the end.
    if ((bit_length_ - level) == 0) {
      continue;
    }

    // Fast encoding of remaining bits if number of points is 1 or 2.
    // Doing this also for 2 gives a slight additional speed up.
    if (num_remaining_points <= 2) {
      // TODO(b/199760123): |axes_| not necessary, remove would change
      // bitstream!
      axes_[0] = axis;
      for (uint32_t i = 1; i < dimension_; i++) {
        axes_[i] = DRACO_INCREMENT_MOD(axes_[i - 1], dimension_);
      }
      for (uint32_t i = 0; i < num_remaining_points; ++i) {
        const auto &p = *(begin + i);
        for (uint32_t j = 0; j < dimension_; j++) {
          const uint32_t num_remaining_bits = bit_length_ - levels[axes_[j]];
          if (num_remaining_bits) {
            remaining_bits_encoder_.EncodeLeastSignificantBits32(
                num_remaining_bits, p[axes_[j]]);
          }
        }
      }
      continue;
    }

    const uint32_t num_remaining_bits = bit_length_ - level;
    const uint32_t modifier = 1 << (num_remaining_bits - 1);
    base_stack_[stack_pos + 1] = old_base;  // copy
    base_stack_[stack_pos + 1][axis] += modifier;
    const VectorUint32 &new_base = base_stack_[stack_pos + 1];

    const RandomAccessIteratorT split =
        std::partition(begin, end, Splitter(axis, new_base[axis]));

    DRACO_DCHECK_EQ(true, (end - begin) > 0);

    // Encode number of points in first and second half.
    const int required_bits = MostSignificantBit(num_remaining_points);

    const uint32_t first_half = static_cast<uint32_t>(split - begin);
    const uint32_t second_half = static_cast<uint32_t>(end - split);
    const bool left = first_half < second_half;

    if (first_half != second_half) {
      half_encoder_.EncodeBit(left);
    }

    if (left) {
      EncodeNumber(required_bits, num_remaining_points / 2 - first_half);
    } else {
      EncodeNumber(required_bits, num_remaining_points / 2 - second_half);
    }

    levels_stack_[stack_pos][axis] += 1;
    levels_stack_[stack_pos + 1] = levels_stack_[stack_pos];  // copy
    if (split != begin) {
      status_stack.push(Status(begin, split, axis, stack_pos));
    }
    if (split != end) {
      status_stack.push(Status(split, end, axis, stack_pos + 1));
    }
  }
}